

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  unsigned_long_long uVar1;
  ZSTD_ErrorCode ZVar2;
  size_t sVar3;
  size_t sVar4;
  XXH64_hash_t XVar5;
  unsigned_long_long uVar6;
  ulong uVar7;
  void *dst_00;
  void *dst_01;
  undefined8 uVar8;
  byte *src_00;
  uint *src_01;
  ulong uVar9;
  uint *puVar10;
  size_t sStack_a0;
  blockProperties_t local_64;
  size_t local_58;
  size_t local_50;
  void *local_48;
  void *local_40;
  undefined8 local_38;
  
  local_50 = dictSize;
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ZSTD_DDict_dictContent(ddict);
    local_50 = ZSTD_DDict_dictSize(ddict);
  }
  uVar8 = 0;
  dst_01 = dst;
  do {
    while( true ) {
      sVar4 = 0xffffffffffffffb8;
      if (srcSize < 5) {
        if (srcSize == 0) {
          sVar4 = (long)dst_01 - (long)dst;
        }
        return sVar4;
      }
      if ((*src & 0xfffffff0) != 0x184d2a50) break;
      if (srcSize < 8) {
        return 0xffffffffffffffb8;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffff2;
      }
      uVar7 = (ulong)*(uint *)((long)src + 4) + 8;
      if (srcSize < uVar7) {
        return 0xffffffffffffffb8;
      }
      srcSize = srcSize - uVar7;
      src = (uint *)((long)src + uVar7);
    }
    local_48 = dst;
    local_38 = uVar8;
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar3 = ZSTD_decompressBegin_usingDict(dctx,dict,local_50);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    ZSTD_checkContinuity(dctx,dst_01);
    uVar7 = srcSize;
    sStack_a0 = sVar4;
    puVar10 = (uint *)src;
    local_40 = dict;
    if ((((8 < srcSize) &&
         (sVar3 = ZSTD_frameHeaderSize(src,5), sStack_a0 = sVar3, sVar3 < 0xffffffffffffff89)) &&
        (sStack_a0 = sVar4, sVar3 + 3 <= srcSize)) &&
       (sStack_a0 = ZSTD_decodeFrameHeader(dctx,src,sVar3), sStack_a0 < 0xffffffffffffff89)) {
      src_01 = (uint *)((long)src + sVar3);
      sVar3 = srcSize - sVar3;
      dst_00 = dst_01;
      do {
        sVar4 = ZSTD_getcBlockSize(src_01,sVar3,&local_64);
        sStack_a0 = sVar4;
        if (0xffffffffffffff88 < sVar4) goto LAB_003961de;
        uVar9 = sVar3 - 3;
        sVar3 = uVar9 - sVar4;
        if (uVar9 < sVar4) {
          sStack_a0 = 0xffffffffffffffb8;
          goto LAB_003961de;
        }
        src_00 = (byte *)((long)src_01 + 3);
        local_58 = sVar4;
        if (local_64.blockType == bt_compressed) {
          uVar8 = 0;
          sVar4 = ZSTD_decompressBlock_internal
                            (dctx,dst_00,(long)dst_01 + (dstCapacity - (long)dst_00),src_00,sVar4,1)
          ;
          sStack_a0 = sVar4;
          if (0xffffffffffffff88 < sVar4) goto LAB_003961de;
        }
        else if (local_64.blockType == bt_rle) {
          sVar4 = (size_t)local_64.origSize;
          if (dst_00 == (void *)0x0) {
            sStack_a0 = 0xffffffffffffffb6;
            if (sVar4 == 0) goto LAB_0039617a;
            goto LAB_003961de;
          }
          if ((long)dst_01 + (dstCapacity - (long)dst_00) < sVar4) goto LAB_0039625a;
          memset(dst_00,(uint)*src_00,sVar4);
        }
        else {
          if (local_64.blockType != bt_raw) goto LAB_003961c9;
          if (dst_00 == (void *)0x0) {
            sStack_a0 = 0xffffffffffffffb6;
            if (sVar4 != 0) goto LAB_003961de;
LAB_0039617a:
            sVar4 = 0;
          }
          else {
            if ((long)dst_01 + (dstCapacity - (long)dst_00) < sVar4) {
LAB_0039625a:
              sStack_a0 = 0xffffffffffffffba;
              goto LAB_003961de;
            }
            memcpy(dst_00,src_00,sVar4);
          }
        }
        if ((dctx->fParams).checksumFlag != 0) {
          XXH64_update(&dctx->xxhState,dst_00,sVar4);
        }
        dst_00 = (void *)((long)dst_00 + sVar4);
        src_01 = (uint *)(src_00 + local_58);
      } while (local_64.lastBlock == 0);
      uVar1 = (dctx->fParams).frameContentSize;
      uVar6 = (long)dst_00 - (long)dst_01;
      if ((uVar1 == 0xffffffffffffffff) || (uVar6 == uVar1)) {
        uVar7 = sVar3;
        sStack_a0 = uVar6;
        puVar10 = src_01;
        if ((dctx->fParams).checksumFlag != 0) {
          XVar5 = XXH64_digest(&dctx->xxhState);
          if (sVar3 < 4) {
            sStack_a0 = 0xffffffffffffffea;
            uVar7 = srcSize;
            puVar10 = (uint *)src;
          }
          else {
            uVar7 = srcSize;
            sStack_a0 = 0xffffffffffffffea;
            puVar10 = (uint *)src;
            if (*src_01 == (uint)XVar5) {
              uVar7 = sVar3 - 4;
              sStack_a0 = uVar6;
              puVar10 = src_01 + 1;
            }
          }
        }
      }
      else {
LAB_003961c9:
        sStack_a0 = 0xffffffffffffffec;
      }
    }
LAB_003961de:
    ZVar2 = ZSTD_getErrorCode(sStack_a0);
    if (((byte)local_38 & ZVar2 == ZSTD_error_prefix_unknown) != 0) {
      return 0xffffffffffffffb8;
    }
    if (0xffffffffffffff88 < sStack_a0) {
      return sStack_a0;
    }
    dst_01 = (void *)((long)dst_01 + sStack_a0);
    dstCapacity = dstCapacity - sStack_a0;
    uVar8 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
    srcSize = uVar7;
    dst = local_48;
    dict = local_40;
    src = puVar10;
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_FRAMEHEADERSIZE_PREFIX) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            /* legacy support is not compatible with static dctx */
            if (dctx->staticSize) return ERROR(memory_allocation);

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                if (ZSTD_isError(skippableSize))
                    return skippableSize;
                if (srcSize < skippableSize) return ERROR(srcSize_wrong);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            CHECK_F(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            CHECK_F(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            if ( (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
              && (moreThan1Frame==1) ) {
                /* at least one frame successfully completed,
                 * but following bytes are garbage :
                 * it's more likely to be a srcSize error,
                 * specifying more bytes than compressed size of frame(s).
                 * This error message replaces ERROR(prefix_unknown),
                 * which would be confusing, as the first header is actually correct.
                 * Note that one could be unlucky, it might be a corruption error instead,
                 * happening right at the place where we expect zstd magic bytes.
                 * But this is _much_ less likely than a srcSize field error. */
                return ERROR(srcSize_wrong);
            }
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ERROR(srcSize_wrong); /* input not entirely consumed */

    return (BYTE*)dst - (BYTE*)dststart;
}